

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O1

int GetMultReg(char *oper,int loc)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint unaff_EBX;
  uint uVar7;
  byte *pbVar8;
  bool bVar9;
  
  iVar3 = IsOperator(oper);
  if (iVar3 == 0) {
    bVar9 = false;
    uVar7 = 0;
    while( true ) {
      iVar3 = 0;
      pbVar2 = (byte *)oper;
      while( true ) {
        pbVar8 = pbVar2 + 1;
        bVar1 = *pbVar2;
        if (((ulong)bVar1 < 0x30) && ((0xa00000000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
        iVar3 = iVar3 + 1;
        pbVar2 = pbVar8;
      }
      if (((uVar7 == 0) && (bVar1 == 0)) || (uVar4 = IsRegister(oper,iVar3), (int)uVar4 < 0)) break;
      if (bVar9) {
        uVar5 = uVar4;
        if ((int)unaff_EBX < (int)uVar4) {
          uVar5 = unaff_EBX;
        }
        if ((int)uVar4 < (int)unaff_EBX) {
          uVar4 = unaff_EBX;
        }
        uVar6 = uVar5;
        do {
          uVar7 = uVar7 | 1 << (uVar6 & 0x1f);
          uVar6 = uVar6 + 1;
        } while (uVar4 + 1 != uVar6);
        uVar4 = uVar5;
        if (*pbVar2 == 0x2d) {
          return 0;
        }
      }
      else {
        uVar7 = uVar7 | 1 << (uVar4 & 0x1f);
      }
      if (*pbVar2 == 0) {
        return uVar7;
      }
      bVar9 = *pbVar2 == 0x2d;
      oper = (char *)pbVar8;
      unaff_EBX = uVar4;
      if (*pbVar8 == 0) {
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

int 
GetMultReg (char *oper, int loc)
/* Builds a register mask for the MOVEM instruction.
 Returns the mask in the low-order portion of its value if
 "oper" is a valid multiple-register list; otherwise returns 0. */
{
	register char *s, *t;
	register int j;
	int t1, t2; /* Temporary variables for registers */
	int range; /* We're processing a range of registers. */
	int multext; /* The result is built here. */

	multext = 0;
	range = FALSE;
	s = oper;
	if (IsOperator(s))
		return (0); /* Starts with an operator! */

	while (1) {
		for (t = s; *t; t++) {
			if ((*t == '-') || (*t == '/')) {
				break;
			}
		}
		if ((multext == 0) && (*t == '\0'))
			return (0); /* Reject single term. */
		if ((t2 = IsRegister(s, (int) (t - s))) < 0)
			return (0); /* Not a recognizable register */

		if (!range) {
			multext |= (1 << t2); /* Single register */
			t1 = t2; /* Save number in case it's a range. */
		} else { /* Range of registers */
			range = FALSE;
			if (t1 > t2) {
				j = t1; /* Swap registers if backwards. */
				t1 = t2;
				t2 = j;
			}
			for (j = t1; j <= t2; j++)
				multext |= (1 << j); /* Mark all registers in range. */
			if (*t == '-')
				return (0); /* Invalid range */
		}
		if (*t == '\0')
			break; /* Normal end of operand */
		if (*t++ == '-')
			range = TRUE; /* Range indicator */
		if (*t == '\0')
			return (0); /* Premature end of operand */
		s = t;
	}
	return (multext);
}